

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextoption.h
# Opt level: O1

bool __thiscall QTextEngine::isRightToLeft(QTextEngine *this)

{
  undefined1 uVar1;
  uint uVar2;
  LayoutDirection LVar3;
  QInputMethod *this_00;
  bool bVar4;
  
  uVar2 = *(uint *)&this->option >> 0xe & 3;
  if (uVar2 == 0) {
    bVar4 = false;
  }
  else if (uVar2 == 1) {
    bVar4 = true;
  }
  else {
    if (this->layoutData == (LayoutData *)0x0) {
      itemize(this);
    }
    if ((this->layoutData->string).d.size != 0) {
      uVar1 = QString::isRightToLeft();
      return (bool)uVar1;
    }
    this_00 = QGuiApplication::inputMethod();
    LVar3 = QInputMethod::inputDirection(this_00);
    bVar4 = LVar3 == RightToLeft;
  }
  return bVar4;
}

Assistant:

inline Qt::LayoutDirection textDirection() const { return Qt::LayoutDirection(direction); }